

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

OwnFd * __thiscall kj::Vector<kj::OwnFd>::add<kj::OwnFd>(Vector<kj::OwnFd> *this,OwnFd *params)

{
  bool bVar1;
  OwnFd *pOVar2;
  OwnFd *params_local;
  Vector<kj::OwnFd> *this_local;
  
  bVar1 = ArrayBuilder<kj::OwnFd>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pOVar2 = fwd<kj::OwnFd>(params);
  pOVar2 = ArrayBuilder<kj::OwnFd>::add<kj::OwnFd>(&this->builder,pOVar2);
  return pOVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }